

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bcm2835.c
# Opt level: O3

int bcm2835_aux_spi_begin(void)

{
  uint32_t *puVar1;
  int iVar2;
  uint32_t *puVar3;
  
  puVar1 = bcm2835_spi1;
  if (bcm2835_spi1 == (uint32_t *)0xffffffffffffffff) {
    iVar2 = 0;
  }
  else {
    puVar3 = bcm2835_aux + 1;
    bcm2835_peri_set_bits(bcm2835_gpio + 1,0xc0000,0x1c0000);
    bcm2835_peri_set_bits(bcm2835_gpio + 1,0x18000000,0x38000000);
    bcm2835_peri_set_bits(bcm2835_gpio + 2,3,7);
    bcm2835_peri_set_bits(bcm2835_gpio + 2,0x18,0x38);
    spi1_speed = 0x7c;
    if (debug == '\0') {
      *puVar3 = 2;
    }
    else {
      printf("bcm2835_peri_write paddr %p, value %08X\n",puVar3,2);
    }
    if (debug == '\0') {
      puVar1[1] = 0;
    }
    else {
      printf("bcm2835_peri_write paddr %p, value %08X\n",puVar1 + 1,0);
    }
    if (debug == '\0') {
      *puVar1 = 0x200;
    }
    else {
      printf("bcm2835_peri_write paddr %p, value %08X\n",puVar1,0x200);
    }
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int bcm2835_aux_spi_begin(void)
{
    volatile uint32_t* enable = bcm2835_aux + BCM2835_AUX_ENABLE/4;
    volatile uint32_t* cntl0 = bcm2835_spi1 + BCM2835_AUX_SPI_CNTL0/4;
    volatile uint32_t* cntl1 = bcm2835_spi1 + BCM2835_AUX_SPI_CNTL1/4;

    if (bcm2835_spi1 == MAP_FAILED)
	return 0; /* bcm2835_init() failed, or not root */

    /* Set the SPI pins to the Alt 4 function to enable SPI1 access on them */
    bcm2835_gpio_fsel(RPI_V2_GPIO_P1_36, BCM2835_GPIO_FSEL_ALT4);	/* SPI1_CE2_N */
    bcm2835_gpio_fsel(RPI_V2_GPIO_P1_35, BCM2835_GPIO_FSEL_ALT4);	/* SPI1_MISO */
    bcm2835_gpio_fsel(RPI_V2_GPIO_P1_38, BCM2835_GPIO_FSEL_ALT4);	/* SPI1_MOSI */
    bcm2835_gpio_fsel(RPI_V2_GPIO_P1_40, BCM2835_GPIO_FSEL_ALT4);	/* SPI1_SCLK */

    bcm2835_aux_spi_setClockDivider(bcm2835_aux_spi_CalcClockDivider(1000000));	// Default 1MHz SPI

    bcm2835_peri_write(enable, BCM2835_AUX_ENABLE_SPI0);
    bcm2835_peri_write(cntl1, 0);
    bcm2835_peri_write(cntl0, BCM2835_AUX_SPI_CNTL0_CLEARFIFO);

    return 1; /* OK */
}